

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash_handler.c
# Opt level: O0

ion_err_t linear_hash_destroy_dictionary(ion_dictionary_id_t id)

{
  int iVar1;
  char local_1c [8];
  char filename [12];
  ion_dictionary_id_t id_local;
  
  filename._4_4_ = id;
  dictionary_get_filename(id,"lhs",local_1c);
  iVar1 = remove(local_1c);
  if (iVar1 == 0) {
    dictionary_get_filename(filename._4_4_,"lhd",local_1c);
    iVar1 = remove(local_1c);
    if (iVar1 == 0) {
      filename[0xb] = '\0';
    }
    else {
      filename[0xb] = '\v';
    }
  }
  else {
    filename[0xb] = '\v';
  }
  return filename[0xb];
}

Assistant:

ion_err_t
linear_hash_destroy_dictionary(
	ion_dictionary_id_t id
) {
	char filename[ION_MAX_FILENAME_LENGTH];

	dictionary_get_filename(id, "lhs", filename);

	if (0 != fremove(filename)) {
		return err_file_delete_error;
	}

	dictionary_get_filename(id, "lhd", filename);

	if (0 != fremove(filename)) {
		return err_file_delete_error;
	}

	return err_ok;
}